

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::Setup::InitializeRestParam
          (Setup *this,InterpreterStackFrame *newInstance,Var *dest)

{
  ushort uVar1;
  FunctionBody *this_00;
  Var *ppvVar2;
  ScriptContext *pSVar3;
  Var pvVar4;
  uint32 elementCount;
  
  this_00 = this->executeFunction;
  uVar1 = (this_00->super_ParseableFunctionInfo).m_inParamCount;
  elementCount = this->inSlotsCount - (uint)uVar1;
  if (elementCount != 0 && (int)(uint)uVar1 <= this->inSlotsCount) {
    ppvVar2 = this->inParams;
    pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    pvVar4 = JavascriptArray::OP_NewScArray(elementCount,pSVar3);
    *dest = pvVar4;
    Memory::CopyArray<void*,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              ((void **)(*(long *)((long)pvVar4 + 0x28) + 0x18),(long)(int)elementCount,
               ppvVar2 + uVar1,(long)(int)elementCount);
    return;
  }
  pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
  pvVar4 = JavascriptArray::OP_NewScArray(0,pSVar3);
  *dest = pvVar4;
  return;
}

Assistant:

void InterpreterStackFrame::Setup::InitializeRestParam(InterpreterStackFrame * newInstance, Var *dest)
    {
        Var *src = this->inParams + executeFunction->GetInParamsCount();

        if (this->inSlotsCount > executeFunction->GetInParamsCount())
        {
            // Create the rest array and copy the args directly into the contiguous head segment.
            int excess = this->inSlotsCount - executeFunction->GetInParamsCount();
            *dest = JavascriptArray::OP_NewScArray(excess, executeFunction->GetScriptContext());
            JavascriptArray *array = static_cast<JavascriptArray *>(*dest);
            Field(Var)* elements = SparseArraySegment<Var>::From(array->GetHead())->elements;
            CopyArray(elements, excess, src, excess);
        }
        else
        {
            // Rest is an empty array when there are no excess parameters.
            *dest = JavascriptArray::OP_NewScArray(0, executeFunction->GetScriptContext());
        }
    }